

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O1

void av1_estimate_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int best_early_term,uint ref_cost_intra
               ,int reuse_prediction,buf_2d *orig_dst,PRED_BUFFER *tmp_buffers,
               PRED_BUFFER **this_mode_pred,RD_STATS *best_rdc,BEST_PICKMODE *best_pickmode,
               PICK_MODE_CONTEXT *ctx,uint *best_sad_norm)

{
  uint64_t uVar1;
  uint64_t uVar2;
  byte tx_size;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  PREDICTION_MODE mode;
  BLOCK_SIZE plane_bsize;
  BLOCK_SIZE BVar6;
  byte bVar7;
  ushort uVar8;
  ushort uVar9;
  aom_tune_content aVar10;
  uint uVar11;
  int iVar12;
  SOURCE_SAD SVar13;
  MB_MODE_INFO *pMVar14;
  PRED_BUFFER *pPVar15;
  SequenceHeader *pSVar16;
  byte bVar17;
  bool bVar18;
  undefined4 uVar19;
  MACROBLOCKD *pMVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  undefined7 in_register_00000011;
  long lVar25;
  int *piVar26;
  long lVar27;
  uint8_t *puVar28;
  byte bVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ushort uVar34;
  uint uVar35;
  ushort uVar36;
  BLOCK_SIZE BVar37;
  ulong uVar38;
  uint8_t *puVar39;
  uint8_t *local_118;
  uint8_t *local_110;
  RD_STATS local_f8;
  uint8_t *local_d0;
  uint8_t *local_c8;
  MACROBLOCKD *local_c0;
  long local_b8;
  estimate_block_intra_args args;
  
  uVar38 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  pMVar14 = *(x->e_mbd).mi;
  uVar8 = *(ushort *)&pMVar14->field_0xa7;
  aVar10 = (cpi->oxcf).tune_cfg.content;
  iVar21 = av1_get_intra_cost_penalty
                     ((cpi->common).quant_params.base_qindex,(cpi->common).quant_params.y_dc_delta_q
                      ,((cpi->common).seq_params)->bit_depth);
  iVar31 = (cpi->sf).rt_sf.check_intra_pred_nonrd;
  if ((((0 < (cpi->svc).spatial_layer_id) && (best_pickmode->best_ref_frame != '\x04')) &&
      (lVar25 = (long)(cpi->svc).temporal_layer_id, 0 < lVar25)) &&
     ((cpi->svc).layer_context[lVar25].is_key_frame == 0)) {
    iVar31 = 0;
  }
  if (cpi->ppi->use_svc == 0) {
    uVar24 = 0x32;
    uVar34 = 0x20;
    if (((cpi->sf).rt_sf.use_nonrd_altref_frame == 0) &&
       (0 < (cpi->sf).rt_sf.nonrd_prune_ref_frame_search)) goto LAB_0022293f;
  }
  else {
LAB_0022293f:
    uVar24 = 0x96;
    uVar34 = 0;
  }
  lVar25 = (long)((ulong)(iVar21 + ref_cost_intra) * (long)x->rdmult + 0x100) >> 9;
  uVar11 = x->source_variance;
  BVar37 = (BLOCK_SIZE)uVar38;
  if (uVar24 <= uVar11) {
    bVar17 = 1;
    if ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0) {
      bVar18 = false;
    }
    else {
      bVar18 = false;
      if ((x->content_state_sb).source_sad_nonrd < kMedSad) {
        iVar31 = 0;
      }
    }
    goto LAB_00222ac6;
  }
  bVar17 = 1;
  if (best_rdc->rdcost != 0x7fffffffffffffff) {
    if (best_pickmode->best_ref_frame == '\x01') {
      uVar9 = pMVar14->mv[0].as_mv.row;
      uVar36 = -uVar9;
      if (0 < (short)uVar9) {
        uVar36 = uVar9;
      }
      if (uVar36 < uVar34) {
        uVar9 = pMVar14->mv[0].as_mv.col;
        uVar36 = -uVar9;
        if (0 < (short)uVar9) {
          uVar36 = uVar9;
        }
        if (uVar36 < uVar34) goto LAB_00222a19;
      }
    }
    iVar21 = iVar21 >> 2;
    lVar25 = (long)((ulong)(iVar21 + ref_cost_intra) * (long)x->rdmult + 0x100) >> 9;
    bVar17 = 0;
  }
LAB_00222a19:
  uVar35 = 0x32;
  if (0x32 < uVar24 >> 1) {
    uVar35 = uVar24 >> 1;
  }
  if (((uVar11 < uVar35) && (kMedSad < (x->content_state_sb).source_sad_nonrd)) ||
     ((bVar18 = false, uVar11 < 0x32 && aVar10 == AOM_CONTENT_SCREEN &&
      ((((BLOCK_32X16 < BVar37 && ((x->content_state_sb).source_sad_nonrd != kZeroSad)) ||
        (x->color_sensitivity[0] == '\x01')) || (x->color_sensitivity[1] == '\x01')))))) {
    bVar18 = true;
  }
  if (BLOCK_32X16 < BVar37) {
    best_early_term = 0;
  }
LAB_00222ac6:
  iVar30 = iVar31;
  if ((((best_rdc->skip_txfm != '\0') && (best_pickmode->best_mode_initial_skip_flag != '\0')) &&
      ((iVar12 = (cpi->sf).rt_sf.skip_intra_pred, iVar12 != 1 ||
       (iVar30 = 0, best_pickmode->best_mode == '\x10')))) && (iVar30 = iVar31, iVar12 == 2)) {
    iVar30 = 0;
  }
  if ((best_rdc->rdcost == 0x7fffffffffffffff || bVar18) ||
     (((best_early_term == 0 && (iVar30 != 0)) && (BVar37 <= (cpi->sf).part_sf.max_intra_bsize)))) {
    lVar33 = lVar25 * 7 >> 3;
    if (aVar10 != AOM_CONTENT_SCREEN) {
      lVar33 = lVar25;
    }
    if (lVar33 <= best_rdc->rdcost) {
      args.mode = '\0';
      args.skippable = 1;
      args.rdc = (RD_STATS *)0x0;
      args.best_sad = 0xffffffff;
      args.prune_mode_based_on_sad = false;
      args.prune_palette_sad = false;
      if (((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) && (10 < (cpi->oxcf).speed)) &&
          ((cpi->rc).high_source_sad != 0)) &&
         ((2 < (cpi->sf).rt_sf.prune_palette_search_nonrd ||
          ((((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0 &&
            ((cpi->rc).frame_spatial_variance < 0x4b0)) &&
           (((cpi->rc).perc_spatial_flat_blocks < 5 &&
            ((uVar11 < 4000 && (0x62 < (cpi->rc).percent_blocks_with_motion)))))))))) {
        args.prune_mode_based_on_sad = false;
        args.prune_palette_sad = true;
      }
      tx_size = ""[uVar38];
      bVar3 = ""[(x->txfm_search_params).tx_mode_search_type];
      if (tx_size < ""[(x->txfm_search_params).tx_mode_search_type]) {
        bVar3 = tx_size;
      }
      bVar29 = 2;
      if (bVar3 < 2) {
        bVar29 = bVar3;
      }
      bVar3 = bVar29;
      if ((aVar10 == AOM_CONTENT_SCREEN) && ((cpi->rc).high_source_sad != 0)) {
        bVar3 = 0;
        if (uVar11 <= uVar24) {
          bVar3 = bVar29;
        }
        if (BLOCK_16X16 < BVar37) {
          bVar3 = bVar29;
        }
      }
      pPVar15 = best_pickmode->best_pred;
      args.cpi = cpi;
      args.x = x;
      if ((pPVar15 != (PRED_BUFFER *)0x0 && reuse_prediction != 0) &&
         (pPVar15->data == orig_dst->buf)) {
        uVar4 = block_size_wide[uVar38];
        uVar5 = block_size_high[uVar38];
        piVar26 = &tmp_buffers->in_use;
        lVar25 = 0;
        do {
          if (*piVar26 == 0) {
            *piVar26 = 1;
            goto LAB_00222d39;
          }
          lVar25 = lVar25 + 1;
          piVar26 = piVar26 + 4;
        } while (lVar25 != 3);
        lVar25 = -1;
LAB_00222d39:
        *this_mode_pred = tmp_buffers + lVar25;
        (*aom_convolve_copy)
                  (pPVar15->data,(long)pPVar15->stride,tmp_buffers[lVar25].data,
                   (long)tmp_buffers[lVar25].stride,(int)uVar4,(int)uVar5);
        best_pickmode->best_pred = *this_mode_pred;
      }
      local_c0 = &x->e_mbd;
      puVar28 = orig_dst->buf;
      puVar39 = orig_dst->buf0;
      iVar31 = orig_dst->height;
      iVar30 = orig_dst->stride;
      uVar19 = *(undefined4 *)&orig_dst->field_0x1c;
      (x->e_mbd).plane[0].dst.width = orig_dst->width;
      (x->e_mbd).plane[0].dst.height = iVar31;
      (x->e_mbd).plane[0].dst.stride = iVar30;
      *(undefined4 *)&(x->e_mbd).plane[0].dst.field_0x1c = uVar19;
      (x->e_mbd).plane[0].dst.buf = puVar28;
      (x->e_mbd).plane[0].dst.buf0 = puVar39;
      lVar25 = (long)(1 << (tx_size & 0x1f));
      local_b8 = lVar25 * 4;
      lVar33 = 0;
      do {
        mode = ""[lVar33];
        iVar31 = (cpi->rd).threshes[uVar8 & 7][uVar38]
                 [mode_idx[0][*(long *)(&DAT_00503490 + (long)(char)mode * 8)]];
        SVar13 = (x->content_state_sb).source_sad_nonrd;
        if ((((bool)(bVar18 & lVar33 != 3)) ||
            ((((uint)(cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar38] >> (""[lVar33] & 0x1f) & 1)
              != 0 && (((lVar33 == 0 || ((cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad != true))
                       || (((x->color_sensitivity[0] != '\0' && (x->color_sensitivity[1] != '\0'))
                           && (((uVar1 = (cpi->rc).frame_source_sad,
                                uVar2 = (cpi->rc).avg_source_sad,
                                (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) -
                                 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
                                1.1 < ((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                                      1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)
                                || ((uVar8 & 7) - 1 < 2)) || (kMedSad < SVar13)))))))))) &&
           (((aVar10 != AOM_CONTENT_SCREEN || ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0)) ||
            (((SVar13 != kZeroSad || ((lVar33 == 0 || (x->source_variance != 0)))) &&
             ((bsize < BLOCK_32X64 || (x->source_variance < 0x33)))))))) {
          if (((bool)(~bVar17 & lVar33 != 3)) ||
             (iVar31 != 0x7fffffff &&
              (long)x->thresh_freq_fact[uVar38]
                    [mode_idx[0][*(long *)(&DAT_00503490 + (long)(char)mode * 8)]] * (long)iVar31 >>
              5 <= best_rdc->rdcost)) {
            plane_bsize = av1_ss_size_lookup[uVar38][(x->e_mbd).plane[1].subsampling_x]
                          [(x->e_mbd).plane[1].subsampling_y];
            pMVar14->mode = mode;
            pMVar14->ref_frame[0] = '\0';
            pMVar14->ref_frame[1] = -1;
            local_f8.rate = 0x7fffffff;
            local_f8.zero_rate = 0;
            local_f8.dist = 0x7fffffffffffffff;
            local_f8.rdcost = 0x7fffffffffffffff;
            local_f8.sse = 0x7fffffffffffffff;
            local_f8.skip_txfm = '\0';
            args.skippable = 1;
            args.rdc = &local_f8;
            pMVar14->tx_size = bVar3;
            iVar31 = (x->e_mbd).plane[0].subsampling_x;
            iVar30 = (x->e_mbd).plane[0].subsampling_y;
            BVar6 = av1_ss_size_lookup[uVar38][iVar31][iVar30];
            iVar12 = (x->e_mbd).mb_to_bottom_edge;
            local_110 = x->plane[0].src.buf;
            local_118 = (x->e_mbd).plane[0].dst.buf;
            uVar24 = (int)((iVar12 >> 0x1f & iVar12 >> ((char)iVar30 + 3U & 0x1f)) +
                          (uint)block_size_high[BVar6]) >> 2;
            local_d0 = local_118;
            local_c8 = local_110;
            args.mode = mode;
            if (0 < (int)uVar24) {
              iVar30 = (x->e_mbd).mb_to_right_edge;
              iVar12 = (x->e_mbd).plane[0].dst.stride;
              iVar31 = (int)((uint)block_size_wide[BVar6] +
                            (iVar30 >> 0x1f & iVar30 >> ((char)iVar31 + 3U & 0x1f))) >> 2;
              pSVar16 = (cpi->common).seq_params;
              lVar22 = local_b8 * iVar12;
              lVar32 = x->plane[0].src.stride * local_b8;
              lVar23 = 0;
              do {
                pMVar20 = local_c0;
                if (0 < iVar31) {
                  bVar29 = block_size_wide[uVar38];
                  bVar7 = block_size_high[uVar38];
                  lVar27 = 0;
                  puVar28 = local_118;
                  puVar39 = local_110;
                  do {
                    x->plane[0].src.buf = puVar39;
                    (x->e_mbd).plane[0].dst.buf = puVar28;
                    av1_predict_intra_block
                              (pMVar20,pSVar16->sb_size,(uint)pSVar16->enable_intra_edge_filter,
                               (uint)bVar29,(uint)bVar7,tx_size,mode,0,0,'\x05',puVar28,iVar12,
                               puVar28,iVar12,0,0,0);
                    lVar27 = lVar27 + lVar25;
                    puVar28 = puVar28 + local_b8;
                    puVar39 = puVar39 + local_b8;
                  } while (lVar27 < iVar31);
                }
                lVar23 = lVar23 + lVar25;
                local_118 = local_118 + lVar22;
                local_110 = local_110 + lVar32;
              } while (lVar23 < (long)(ulong)uVar24);
            }
            x->plane[0].src.buf = local_c8;
            (x->e_mbd).plane[0].dst.buf = local_d0;
            av1_block_yrd(x,&local_f8,&args.skippable,bsize,pMVar14->tx_size);
            pMVar20 = local_c0;
            if (x->color_sensitivity[0] != '\0') {
              av1_foreach_transformed_block_in_plane
                        (local_c0,plane_bsize,1,av1_estimate_block_intra,&args);
            }
            if (x->color_sensitivity[1] != '\0') {
              av1_foreach_transformed_block_in_plane
                        (pMVar20,plane_bsize,2,av1_estimate_block_intra,&args);
            }
            iVar31 = 0;
            if ((BLOCK_8X4 < bsize) && (iVar31 = 0, 0xf7 < (byte)(mode - 9))) {
              iVar31 = (x->mode_costs).angle_delta_cost[(long)(char)mode + -1]
                       [(long)pMVar14->angle_delta[0] + 3];
            }
            if ((((lVar33 == 0) && (bsize != BLOCK_INVALID)) &&
                (((cpi->common).seq_params)->enable_filter_intra != '\0')) &&
               (((0x1f07ffUL >> (BVar37 & 0x3f) & 1) != 0 &&
                ((0x2f0bffUL >> (BVar37 & 0x3f) & 1) != 0)))) {
              iVar31 = iVar31 + (x->mode_costs).filter_intra_cost[uVar38][0];
            }
            iVar31 = iVar31 + iVar21 + ref_cost_intra + local_f8.rate;
            local_f8.rate = iVar31;
            local_f8.rdcost = local_f8.dist * 0x80 + ((long)x->rdmult * (long)iVar31 + 0x100 >> 9);
            if ((aVar10 == AOM_CONTENT_SCREEN) && ((cpi->sf).rt_sf.source_metrics_sb_nonrd != 0)) {
              iVar30 = (cpi->rc).high_source_sad;
              if (iVar30 == 0) {
LAB_002234f9:
                if ((((x->source_variance != 0) &&
                     ((x->content_state_sb).source_sad_nonrd == kZeroSad)) &&
                    (x->color_sensitivity[0] == '\0')) && (x->color_sensitivity[1] == '\0')) {
                  local_f8.rdcost = (local_f8.rdcost >> 1) + local_f8.rdcost;
                }
              }
              else if ((x->source_variance < 800) &&
                      ((x->color_sensitivity[0] != '\0' || (x->color_sensitivity[1] != '\0')))) {
                local_f8.rdcost = local_f8.rdcost * 7 >> 3;
              }
              else if (iVar30 == 0) goto LAB_002234f9;
            }
            if (local_f8.rdcost < best_rdc->rdcost) {
              *(ulong *)&best_rdc->skip_txfm = CONCAT71(local_f8._33_7_,local_f8.skip_txfm);
              best_rdc->rdcost = local_f8.rdcost;
              best_rdc->sse = local_f8.sse;
              best_rdc->rate = iVar31;
              best_rdc->zero_rate = local_f8.zero_rate;
              best_rdc->dist = local_f8.dist;
              best_pickmode->best_mode = mode;
              best_pickmode->best_tx_size = pMVar14->tx_size;
              best_pickmode->best_ref_frame = '\0';
              best_pickmode->best_second_ref_frame = '\0';
              best_pickmode->best_mode_skip_txfm = local_f8.skip_txfm;
              pMVar14->uv_mode = mode;
              pMVar14->mv[0] = (int_mv)0x80008000;
              pMVar14->mv[1] = (int_mv)0x80008000;
              if (local_f8.skip_txfm == '\0') {
                memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
              }
            }
          }
        }
        lVar33 = lVar33 + 1;
      } while (lVar33 != 4);
      if (best_pickmode->best_ref_frame == '\0') {
        memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
      }
      pMVar14->tx_size = best_pickmode->best_tx_size;
      *best_sad_norm = args.best_sad >> (""[uVar38] + ""[uVar38] & 0x1f);
    }
  }
  return;
}

Assistant:

void av1_estimate_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                             int best_early_term, unsigned int ref_cost_intra,
                             int reuse_prediction, struct buf_2d *orig_dst,
                             PRED_BUFFER *tmp_buffers,
                             PRED_BUFFER **this_mode_pred, RD_STATS *best_rdc,
                             BEST_PICKMODE *best_pickmode,
                             PICK_MODE_CONTEXT *ctx,
                             unsigned int *best_sad_norm) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const unsigned char segment_id = mi->segment_id;
  const int *const rd_threshes = cpi->rd.threshes[segment_id][bsize];
  const int *const rd_thresh_freq_fact = x->thresh_freq_fact[bsize];
  const bool is_screen_content =
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  const REAL_TIME_SPEED_FEATURES *const rt_sf = &cpi->sf.rt_sf;

  const CommonQuantParams *quant_params = &cm->quant_params;

  RD_STATS this_rdc;

  int intra_cost_penalty = av1_get_intra_cost_penalty(
      quant_params->base_qindex, quant_params->y_dc_delta_q,
      cm->seq_params->bit_depth);
  int64_t inter_mode_thresh =
      RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
  int perform_intra_pred = rt_sf->check_intra_pred_nonrd;
  int force_intra_check = 0;
  // For spatial enhancement layer: turn off intra prediction if the
  // previous spatial layer as golden ref is not chosen as best reference.
  // only do this for temporal enhancement layer and on non-key frames.
  if (cpi->svc.spatial_layer_id > 0 &&
      best_pickmode->best_ref_frame != GOLDEN_FRAME &&
      cpi->svc.temporal_layer_id > 0 &&
      !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame)
    perform_intra_pred = 0;

  int do_early_exit_rdthresh = 1;

  uint32_t spatial_var_thresh = 50;
  int motion_thresh = 32;
  // Adjust thresholds to make intra mode likely tested if the other
  // references (golden, alt) are skipped/not checked. For now always
  // adjust for svc mode.
  if (cpi->ppi->use_svc || (rt_sf->use_nonrd_altref_frame == 0 &&
                            rt_sf->nonrd_prune_ref_frame_search > 0)) {
    spatial_var_thresh = 150;
    motion_thresh = 0;
  }

  // Some adjustments to checking intra mode based on source variance.
  if (x->source_variance < spatial_var_thresh) {
    // If the best inter mode is large motion or non-LAST ref reduce intra cost
    // penalty, so intra mode is more likely tested.
    if (best_rdc->rdcost != INT64_MAX &&
        (best_pickmode->best_ref_frame != LAST_FRAME ||
         abs(mi->mv[0].as_mv.row) >= motion_thresh ||
         abs(mi->mv[0].as_mv.col) >= motion_thresh)) {
      intra_cost_penalty = intra_cost_penalty >> 2;
      inter_mode_thresh =
          RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
      do_early_exit_rdthresh = 0;
    }
    if ((x->source_variance < AOMMAX(50, (spatial_var_thresh >> 1)) &&
         x->content_state_sb.source_sad_nonrd >= kHighSad) ||
        (is_screen_content && x->source_variance < 50 &&
         ((bsize >= BLOCK_32X32 &&
           x->content_state_sb.source_sad_nonrd != kZeroSad) ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)))
      force_intra_check = 1;
    // For big blocks worth checking intra (since only DC will be checked),
    // even if best_early_term is set.
    if (bsize >= BLOCK_32X32) best_early_term = 0;
  } else if (rt_sf->source_metrics_sb_nonrd &&
             x->content_state_sb.source_sad_nonrd <= kLowSad) {
    perform_intra_pred = 0;
  }

  if (best_rdc->skip_txfm && best_pickmode->best_mode_initial_skip_flag) {
    if (rt_sf->skip_intra_pred == 1 && best_pickmode->best_mode != NEWMV)
      perform_intra_pred = 0;
    else if (rt_sf->skip_intra_pred == 2)
      perform_intra_pred = 0;
  }

  if (!(best_rdc->rdcost == INT64_MAX || force_intra_check ||
        (perform_intra_pred && !best_early_term &&
         bsize <= cpi->sf.part_sf.max_intra_bsize))) {
    return;
  }

  // Early exit based on RD cost calculated using known rate. When
  // is_screen_content is true, more bias is given to intra modes. Hence,
  // considered conservative threshold in early exit for the same.
  const int64_t known_rd = is_screen_content
                               ? CALC_BIASED_RDCOST(inter_mode_thresh)
                               : inter_mode_thresh;
  if (known_rd > best_rdc->rdcost) return;

  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  if (prune_palette_testing_inter(cpi, x->source_variance))
    args.prune_palette_sad = true;
  TX_SIZE intra_tx_size = AOMMIN(
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]),
      TX_16X16);
  if (is_screen_content && cpi->rc.high_source_sad &&
      x->source_variance > spatial_var_thresh && bsize <= BLOCK_16X16)
    intra_tx_size = TX_4X4;

  PRED_BUFFER *const best_pred = best_pickmode->best_pred;
  if (reuse_prediction && best_pred != NULL) {
    const int bh = block_size_high[bsize];
    const int bw = block_size_wide[bsize];
    if (best_pred->data == orig_dst->buf) {
      *this_mode_pred = &tmp_buffers[get_pred_buffer(tmp_buffers, 3)];
      aom_convolve_copy(best_pred->data, best_pred->stride,
                        (*this_mode_pred)->data, (*this_mode_pred)->stride, bw,
                        bh);
      best_pickmode->best_pred = *this_mode_pred;
    }
  }
  pd->dst = *orig_dst;

  for (int midx = 0; midx < RTC_INTRA_MODES; ++midx) {
    const PREDICTION_MODE this_mode = intra_mode_list[midx];
    const THR_MODES mode_index = mode_idx[INTRA_FRAME][mode_offset(this_mode)];
    const int64_t mode_rd_thresh = rd_threshes[mode_index];

    if (is_prune_intra_mode(cpi, midx, force_intra_check, bsize, segment_id,
                            x->content_state_sb.source_sad_nonrd,
                            x->color_sensitivity))
      continue;

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For spatially flat blocks with zero motion only check
      // DC mode.
      if (x->content_state_sb.source_sad_nonrd == kZeroSad &&
          x->source_variance == 0 && this_mode != DC_PRED)
        continue;
      // Only test Intra for big blocks if spatial_variance is small.
      else if (bsize > BLOCK_32X32 && x->source_variance > 50)
        continue;
    }

    if (rd_less_than_thresh(best_rdc->rdcost, mode_rd_thresh,
                            rd_thresh_freq_fact[mode_index]) &&
        (do_early_exit_rdthresh || this_mode == SMOOTH_PRED)) {
      continue;
    }
    const BLOCK_SIZE uv_bsize =
        get_plane_block_size(bsize, xd->plane[AOM_PLANE_U].subsampling_x,
                             xd->plane[AOM_PLANE_U].subsampling_y);

    mi->mode = this_mode;
    mi->ref_frame[0] = INTRA_FRAME;
    mi->ref_frame[1] = NONE_FRAME;

    av1_invalid_rd_stats(&this_rdc);
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->tx_size = intra_tx_size;
    compute_intra_yprediction(cm, this_mode, bsize, x, xd);
    // Look into selecting tx_size here, based on prediction residual.
    av1_block_yrd(x, &this_rdc, &args.skippable, bsize, mi->tx_size);
    // TODO(kyslov@) Need to account for skippable
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_U,
                                             av1_estimate_block_intra, &args);
    }
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_V,
                                             av1_estimate_block_intra, &args);
    }

    int mode_cost = 0;
    if (av1_is_directional_mode(this_mode) && av1_use_angle_delta(bsize)) {
      mode_cost +=
          x->mode_costs.angle_delta_cost[this_mode - V_PRED]
                                        [MAX_ANGLE_DELTA +
                                         mi->angle_delta[PLANE_TYPE_Y]];
    }
    if (this_mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
      mode_cost += x->mode_costs.filter_intra_cost[bsize][0];
    }
    this_rdc.rate += ref_cost_intra;
    this_rdc.rate += intra_cost_penalty;
    this_rdc.rate += mode_cost;
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For blocks with low spatial variance and color sad,
      // favor the intra-modes, only on scene/slide change.
      if (cpi->rc.high_source_sad && x->source_variance < 800 &&
          (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]))
        this_rdc.rdcost = CALC_BIASED_RDCOST(this_rdc.rdcost);
      // Otherwise bias against intra for blocks with zero
      // motion and no color, on non-scene/slide changes.
      else if (!cpi->rc.high_source_sad && x->source_variance > 0 &&
               x->content_state_sb.source_sad_nonrd == kZeroSad &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
        this_rdc.rdcost = (3 * this_rdc.rdcost) >> 1;
    }

    if (this_rdc.rdcost < best_rdc->rdcost) {
      *best_rdc = this_rdc;
      best_pickmode->best_mode = this_mode;
      best_pickmode->best_tx_size = mi->tx_size;
      best_pickmode->best_ref_frame = INTRA_FRAME;
      best_pickmode->best_second_ref_frame = NONE;
      best_pickmode->best_mode_skip_txfm = this_rdc.skip_txfm;
      mi->uv_mode = this_mode;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      if (!this_rdc.skip_txfm)
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    }
  }
  if (best_pickmode->best_ref_frame == INTRA_FRAME)
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  mi->tx_size = best_pickmode->best_tx_size;

  *best_sad_norm = args.best_sad >>
                   (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);
}